

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool Args::details::isCorrectFlag(String *flag)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  allocator local_9;
  
  if (flag->_M_string_length == 1) {
    if (isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_ == '\0') {
      iVar1 = __cxa_guard_acquire(&isCorrectFlag(std::__cxx11::string_const&)::
                                   availableSymbols_abi_cxx11_);
      if (iVar1 != 0) {
        std::__cxx11::string::string
                  ((string *)
                   &isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                   "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ",&local_9);
        __cxa_atexit(std::__cxx11::string::~string,
                     &isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_
                           );
      }
    }
    lVar2 = std::__cxx11::string::find
                      ((string *)
                       &isCorrectFlag(std::__cxx11::string_const&)::availableSymbols_abi_cxx11_,
                       (ulong)flag);
    bVar3 = lVar2 != -1;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static inline bool
isCorrectFlag( const String & flag )
{
	if( flag.empty() || flag.length() > 1 )
		return false;

	static const String availableSymbols( SL( "0123456789"
		"abcdefghijklmnopqrstuvwxyz"
		"ABCDEFGHIJKLMNOPQRSTUVWXYZ" ) );

	return ( availableSymbols.find( flag ) != String::npos );
}